

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

int ppc_hash64_handle_mmu_fault(PowerPCCPU_conflict3 *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  uint uVar1;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  ppc_slb_t *slb;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint64_t uVar9;
  uint uVar10;
  uint *puVar11;
  target_ulong size;
  ulong uVar12;
  hwaddr hVar13;
  uint uVar14;
  bool bVar15;
  uint apshift;
  ppc_hash_pte64_t pte;
  ppc_v3_pate_t pate;
  ppc_slb_t vrma_slbe;
  uint local_6c;
  ppc_hash_pte64_t local_68;
  ppc_v3_pate_t local_58;
  ppc_slb_t local_48;
  
  if (2 < (uint)rwx) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x389,"int ppc_hash64_handle_mmu_fault(PowerPCCPU *, vaddr, int, int)");
  }
  if (rwx != 2) {
    if (((cpu->env).msr & 0x10) != 0) goto LAB_00b69293;
LAB_00b691de:
    uVar12 = eaddr & 0xfffffffffffffff;
    if ((((cpu->env).msr & 0x1000000000000000) == 0) && ((cpu->env).has_hv_mode != false)) {
      if (((cpu->env).mmu_model == POWERPC_MMU_3_00) || ((long)(cpu->env).spr[0x13e] < 0)) {
        slb = &local_48;
        iVar4 = build_vrma_slbe(cpu,slb);
        if (iVar4 != 0) {
          (cpu->parent_obj).exception_index = 1;
LAB_00b693b3:
          (cpu->env).error_code = 0;
          return 1;
        }
        goto LAB_00b692aa;
      }
      uVar2 = *(ulong *)(rmls_limit_rma_sizes + ((uint)(cpu->env).spr[0x13e] >> 0x17 & 0x78));
      if (uVar12 < uVar2) {
        uVar7 = (cpu->env).spr[0x138] | uVar12;
      }
      else {
        uVar7 = uVar12;
        if (rwx == 2) {
          ppc_hash64_set_isi(&cpu->parent_obj,0x8000000);
        }
        else {
          ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,(ulong)((uint)(rwx == 1) << 0x19) | 0x8000000);
        }
      }
      bVar15 = uVar2 <= uVar12;
      uVar12 = uVar7;
      if (bVar15) {
        return 1;
      }
    }
    else if (-1 < (long)eaddr) {
      uVar12 = uVar12 | (cpu->env).spr[0x139];
    }
    hVar13 = uVar12 & 0xfffffffffffff000;
    size = 0x1000;
    uVar14 = 7;
    goto LAB_00b69284;
  }
  if (((cpu->env).msr & 0x20) == 0) goto LAB_00b691de;
LAB_00b69293:
  slb = slb_lookup(cpu,eaddr);
  if (slb == (ppc_slb_t *)0x0) {
    if ((*(byte *)((long)(cpu->env).spr + 0x9f2) & 0x40) == 0) {
      if (rwx != 2) {
        (cpu->parent_obj).exception_index = 0x41;
        (cpu->env).error_code = 0;
        (cpu->env).spr[0x13] = eaddr;
        return 1;
      }
      (cpu->parent_obj).exception_index = 0x42;
      goto LAB_00b693b3;
    }
    ppc_hash64_handle_mmu_fault_cold_1();
    goto LAB_00b696a0;
  }
LAB_00b692aa:
  if ((rwx == 2) && ((slb->vsid & 0x200) != 0)) {
    uVar9 = 0x10000000;
    goto LAB_00b694c4;
  }
  hVar13 = ppc_hash64_htab_lookup(cpu,slb,eaddr,&local_68,&local_6c);
  if (hVar13 == 0xffffffffffffffff) {
    if (rwx == 2) {
      uVar9 = 0x40000000;
      goto LAB_00b694c4;
    }
    uVar9 = (ulong)((uint)(rwx == 1) << 0x19) | 0x40000000;
    goto LAB_00b69551;
  }
  iVar4 = ((uint)local_68.pte1 & 3) + (int)((long)local_68.pte1 >> 0x3f) * -4;
  if (((uint)slb->vsid & (uint)(((cpu->env).msr & 0x4000) == 0) * 0x400 + 0x400) == 0) {
    if (iVar4 != 7) {
      uVar5 = *(uint *)(&DAT_00dbec10 + (uint)(iVar4 * 4));
      puVar11 = (uint *)(&DAT_00dbec2c + (uint)(iVar4 * 4));
      goto LAB_00b69401;
    }
LAB_00b693c7:
    uVar8 = 0;
    uVar5 = 0x8000000;
  }
  else {
    if (2 < iVar4 - 1U) goto LAB_00b693c7;
    puVar11 = (uint *)(&DAT_00dbec48 + (ulong)(iVar4 - 1U) * 4);
    uVar5 = 0;
LAB_00b69401:
    uVar8 = *puVar11;
  }
  uVar10 = 7;
  if ((cpu->hash64_opts->flags & 2) != 0) {
    bVar6 = (byte)(local_68.pte1 >> 9) & 7 | (byte)(local_68.pte1 >> 0x39) & 0x18;
    uVar10 = (uint)((cpu->env).spr[0x1d] >> (bVar6 * '\x02' ^ 0x3e)) & 3;
    if (((cpu->env).mmu_model & ~POWERPC_MMU_32B) == POWERPC_MMU_2_07) {
      uVar10 = (uint)(((cpu->env).spr[0x3d] >> ((ulong)(byte)(bVar6 * -2 + 0x3e) & 0x3f) & 1) == 0)
               * 4 + 3 ^ uVar10;
    }
    else {
      uVar10 = uVar10 ^ 7;
    }
  }
  uVar14 = (uint)((local_68.pte1 & 0xc) == 0) * 4 + 3 & uVar8 & uVar10;
  uVar1 = *(uint *)(&DAT_00dbe6f0 + (ulong)(uint)rwx * 4);
  if ((uVar1 & ~uVar14) != 0) {
    if (rwx != 2) {
      uVar5 = (uint)((uVar1 & ~uVar8) != 0) * 0x8000000;
      uVar14 = uVar5 + 0x2000000;
      if (rwx != 1) {
        uVar14 = uVar5;
      }
      uVar9 = (uint64_t)(uVar14 + 0x200000);
      if ((uVar1 & ~uVar10) == 0) {
        uVar9 = (uint64_t)uVar14;
      }
LAB_00b69551:
      ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,uVar9);
      return 1;
    }
    uVar14 = 0x10000000;
    if ((local_68.pte1 & 0xc) == 0) {
      uVar14 = uVar5;
    }
    uVar9 = (uint64_t)(((uVar10 & 0xfffffffc) << 0x13 | uVar14) ^ 0x200000);
LAB_00b694c4:
    ppc_hash64_set_isi(&cpu->parent_obj,uVar9);
    return 1;
  }
  if (((uint)local_68.pte1 >> 8 & 1) == 0) {
    if ((cpu->env).mmu_model == POWERPC_MMU_3_00) {
      _Var3 = ppc64_v3_get_pate(cpu,(target_ulong_conflict)(cpu->env).spr[0x13f],&local_58);
      if (_Var3) goto LAB_00b69590;
      local_58.dw0 = 0;
    }
    else {
      local_58.dw0 = (cpu->env).spr[0x19];
LAB_00b69590:
      local_58.dw0 = local_58.dw0 & 0xffffffffffc0000;
    }
    address_space_stb_ppc64
              ((cpu->env).uc,(cpu->parent_obj).as,hVar13 * 0x10 + local_58.dw0 + 0x10,
               (uint)(local_68.pte1 >> 8) & 0xff | 1,(MemTxAttrs)0x1,(MemTxResult *)0x0);
  }
  if (-1 < (char)local_68.pte1) {
    if (rwx == 1) {
      ppc_hash64_set_c(cpu,hVar13,local_68.pte1);
    }
    else {
      uVar14 = uVar14 & 0xfffffffd;
    }
  }
  if (0x3f < local_6c - 1) {
LAB_00b696a0:
    __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                  ,0x1bd,"uint64_t deposit64(uint64_t, int, int, uint64_t)");
  }
  bVar6 = -(byte)local_6c;
  hVar13 = ((eaddr & 0xfffffffffffff000 ^ local_68.pte1 & 0xffffffffffff000) << (bVar6 & 0x3f)) >>
           (bVar6 & 0x3f) ^ local_68.pte1 & 0xffffffffffff000;
  size = 1L << ((byte)local_6c & 0x3f);
LAB_00b69284:
  tlb_set_page_ppc64(&cpu->parent_obj,eaddr & 0xfffffffffffff000,hVar13,uVar14,mmu_idx,size);
  return 0;
}

Assistant:

int ppc_hash64_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr,
                                int rwx, int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    unsigned apshift;
    hwaddr ptex;
    ppc_hash_pte64_t pte;
    int exec_prot, pp_prot, amr_prot, prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /*
     * Note on LPCR usage: 970 uses HID4, but our special variant of
     * store_spr copies relevant fields into env->spr[SPR_LPCR].
     * Similarily we filter unimplemented bits when storing into LPCR
     * depending on the MMU version. This code can thus just use the
     * LPCR "as-is".
     */

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /*
         * Translation is supposedly "off", but in real mode the top 4
         * effective address bits are (mostly) ignored
         */
        raddr = eaddr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
        } else
#endif
        if (msr_hv || !env->has_hv_mode) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            if (!(eaddr >> 63)) {
                raddr |= env->spr[SPR_HRMOR];
            }
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                /* Invalid VRMA setup, machine check */
                cs->exception_index = POWERPC_EXCP_MCHECK;
                env->error_code = 0;
                return 1;
            }

            goto skip_slb_search;
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                if (rwx == 2) {
                    ppc_hash64_set_isi(cs, SRR1_PROTFAULT);
                } else {
                    int dsisr = DSISR_PROTFAULT;
                    if (rwx == 1) {
                        dsisr |= DSISR_ISSTORE;
                    }
                    ppc_hash64_set_dsi(cs, eaddr, dsisr);
                }
                return 1;
            }

            raddr |= env->spr[SPR_RMOR];
        }
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Translation is on, so look up the SLB */
    slb = slb_lookup(cpu, eaddr);
    if (!slb) {
        /* No entry found, check if in-memory segment tables are in use */
        if (ppc64_use_proc_tbl(cpu)) {
            /* TODO - Unsupported */
            fprintf(stderr, "Segment Table Support Unimplemented");
            exit(1);
        }
        /* Segment still not found, generate the appropriate interrupt */
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISEG;
            env->error_code = 0;
        } else {
            cs->exception_index = POWERPC_EXCP_DSEG;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
        }
        return 1;
    }

skip_slb_search:

    /* 3. Check for segment level no-execute violation */
    if ((rwx == 2) && (slb->vsid & SLB_VSID_N)) {
        ppc_hash64_set_isi(cs, SRR1_NOEXEC_GUARD);
        return 1;
    }

    /* 4. Locate the PTE in the hash table */
    ptex = ppc_hash64_htab_lookup(cpu, slb, eaddr, &pte, &apshift);
    if (ptex == -1) {
        if (rwx == 2) {
            ppc_hash64_set_isi(cs, SRR1_NOPTE);
        } else {
            int dsisr = DSISR_NOPTE;
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                  "found PTE at index %08" HWADDR_PRIx "\n", ptex);

    /* 5. Check access permissions */

    exec_prot = ppc_hash64_pte_noexec_guard(cpu, pte);
    pp_prot = ppc_hash64_pte_prot(cpu, slb, pte);
    amr_prot = ppc_hash64_amr_prot(cpu, pte);
    prot = exec_prot & pp_prot & amr_prot;

    if ((need_prot[rwx] & ~prot) != 0) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            int srr1 = 0;
            if (PAGE_EXEC & ~exec_prot) {
                srr1 |= SRR1_NOEXEC_GUARD; /* Access violates noexec or guard */
            } else if (PAGE_EXEC & ~pp_prot) {
                srr1 |= SRR1_PROTFAULT; /* Access violates access authority */
            }
            if (PAGE_EXEC & ~amr_prot) {
                srr1 |= SRR1_IAMR; /* Access violates virt pg class key prot */
            }
            ppc_hash64_set_isi(cs, srr1);
        } else {
            int dsisr = 0;
            if (need_prot[rwx] & ~pp_prot) {
                dsisr |= DSISR_PROTFAULT;
            }
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            if (need_prot[rwx] & ~amr_prot) {
                dsisr |= DSISR_AMR;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 6. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE64_R_R)) {
        ppc_hash64_set_r(cpu, ptex, pte.pte1);
    }
    if (!(pte.pte1 & HPTE64_R_C)) {
        if (rwx == 1) {
            ppc_hash64_set_c(cpu, ptex, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
    }

    /* 7. Determine the real address from the PTE */

    raddr = deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, 1ULL << apshift);

    return 0;
}